

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O0

LLVMDependenceGraph * __thiscall
dg::LLVMDependenceGraph::buildSubgraph(LLVMDependenceGraph *this,LLVMNode *node)

{
  LLVMDependenceGraph *pLVar1;
  Value *in_RDI;
  Function *callFunc;
  CallInst *CInst;
  Value *val;
  CallBase *in_stack_ffffffffffffffd8;
  
  LLVMNode::getValue((LLVMNode *)0x17cb82);
  llvm::dyn_cast<llvm::CallInst,llvm::Value>(in_RDI);
  llvm::CallBase::getCalledFunction(in_stack_ffffffffffffffd8);
  pLVar1 = buildSubgraph(this,node,(Function *)val,CInst._7_1_);
  return pLVar1;
}

Assistant:

LLVMDependenceGraph *LLVMDependenceGraph::buildSubgraph(LLVMNode *node) {
    using namespace llvm;

    Value *val = node->getValue();
    CallInst *CInst = dyn_cast<CallInst>(val);
    assert(CInst && "buildSubgraph called on non-CallInst");
    Function *callFunc = CInst->getCalledFunction();

    return buildSubgraph(node, callFunc);
}